

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O3

int aom_yv12_realloc_with_new_border_c
              (YV12_BUFFER_CONFIG *ybf,int new_border,int byte_alignment,_Bool alloc_pyramid,
              int num_planes)

{
  int iVar1;
  YV12_BUFFER_CONFIG new_buf;
  
  if (ybf == (YV12_BUFFER_CONFIG *)0x0) {
    iVar1 = -2;
  }
  else {
    iVar1 = 0;
    if (ybf->border != new_border) {
      memset(&new_buf,0,0xd0);
      iVar1 = aom_alloc_frame_buffer
                        (&new_buf,(ybf->field_2).field_0.y_crop_width,
                         (ybf->field_3).field_0.y_crop_height,ybf->subsampling_x,ybf->subsampling_y,
                         ybf->flags & 8,new_border,byte_alignment,alloc_pyramid,0);
      if (iVar1 == 0) {
        aom_yv12_copy_frame_c(ybf,&new_buf,num_planes);
        aom_extend_frame_borders_c(&new_buf,num_planes);
        aom_free_frame_buffer(ybf);
        memcpy(ybf,&new_buf,0xd0);
      }
    }
  }
  return iVar1;
}

Assistant:

int aom_yv12_realloc_with_new_border_c(YV12_BUFFER_CONFIG *ybf, int new_border,
                                       int byte_alignment, bool alloc_pyramid,
                                       int num_planes) {
  if (ybf) {
    if (new_border == ybf->border) return 0;
    YV12_BUFFER_CONFIG new_buf;
    memset(&new_buf, 0, sizeof(new_buf));
    const int error = aom_alloc_frame_buffer(
        &new_buf, ybf->y_crop_width, ybf->y_crop_height, ybf->subsampling_x,
        ybf->subsampling_y, ybf->flags & YV12_FLAG_HIGHBITDEPTH, new_border,
        byte_alignment, alloc_pyramid, 0);
    if (error) return error;
    // Copy image buffer
    aom_yv12_copy_frame(ybf, &new_buf, num_planes);

    // Extend up to new border
    aom_extend_frame_borders(&new_buf, num_planes);

    // Now free the old buffer and replace with the new
    aom_free_frame_buffer(ybf);
    memcpy(ybf, &new_buf, sizeof(new_buf));
    return 0;
  }
  return -2;
}